

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_function.hpp
# Opt level: O1

void __thiscall duckdb::CopyFunction::CopyFunction(CopyFunction *this,CopyFunction *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t sVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  undefined8 uVar6;
  SimpleNamedParameterFunction *pSVar7;
  SimpleNamedParameterFunction *pSVar8;
  undefined4 uVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>_>_>
  local_28;
  
  (this->super_Function)._vptr_Function = (_func_int **)&PTR__Function_01993750;
  (this->super_Function).name._M_dataplus._M_p = (pointer)&(this->super_Function).name.field_2;
  pcVar2 = (param_1->super_Function).name._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Function).name,pcVar2,
             pcVar2 + (param_1->super_Function).name._M_string_length);
  (this->super_Function).extra_info._M_dataplus._M_p =
       (pointer)&(this->super_Function).extra_info.field_2;
  pcVar2 = (param_1->super_Function).extra_info._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_Function).extra_info,pcVar2,
             pcVar2 + (param_1->super_Function).extra_info._M_string_length);
  (this->super_Function)._vptr_Function = (_func_int **)&PTR__CopyFunction_019966c8;
  switchD_00b1422a::default(&this->plan,&param_1->plan,0x90);
  SimpleFunction::SimpleFunction
            ((SimpleFunction *)&this->copy_from_function,
             (SimpleFunction *)&param_1->copy_from_function);
  (this->copy_from_function).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
  _vptr_Function = (_func_int **)&PTR__SimpleNamedParameterFunction_01993798;
  local_28._M_h =
       (__hashtable_alloc *)
       &(this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h._M_buckets =
       (__buckets_ptr)0x0;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
  _M_bucket_count =
       (param_1->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_bucket_count;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
  _M_element_count =
       (param_1->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
       _M_element_count;
  pSVar7 = &(param_1->copy_from_function).super_SimpleNamedParameterFunction;
  uVar9 = *(undefined4 *)&(pSVar7->named_parameters)._M_h._M_rehash_policy.field_0x4;
  sVar3 = (param_1->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
          _M_rehash_policy._M_next_resize;
  pSVar8 = &(this->copy_from_function).super_SimpleNamedParameterFunction;
  (pSVar8->named_parameters)._M_h._M_rehash_policy._M_max_load_factor =
       (pSVar7->named_parameters)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(pSVar8->named_parameters)._M_h._M_rehash_policy.field_0x4 = uVar9;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
  _M_rehash_policy._M_next_resize = sVar3;
  (this->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::LogicalType>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_28._M_h,
             &(param_1->copy_from_function).super_SimpleNamedParameterFunction.named_parameters._M_h
             ,&local_28);
  (this->copy_from_function).super_SimpleNamedParameterFunction.super_SimpleFunction.super_Function.
  _vptr_Function = (_func_int **)&PTR__TableFunction_01993668;
  switchD_00b1422a::default
            (&(this->copy_from_function).bind,&(param_1->copy_from_function).bind,0xd6);
  (this->copy_from_function).function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar4 = (param_1->copy_from_function).function_info.internal.
           super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var5 = (param_1->copy_from_function).function_info.internal.
           super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (param_1->copy_from_function).function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->copy_from_function).function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (this->copy_from_function).function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var5;
  (param_1->copy_from_function).function_info.internal.
  super___shared_ptr<duckdb::TableFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->copy_from_function).global_initialization =
       (param_1->copy_from_function).global_initialization;
  paVar1 = &(this->extension).field_2;
  (this->extension)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (param_1->extension)._M_dataplus._M_p;
  paVar10 = &(param_1->extension).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar10) {
    uVar6 = *(undefined8 *)((long)&(param_1->extension).field_2 + 8);
    paVar1->_M_allocated_capacity = paVar10->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->extension).field_2 + 8) = uVar6;
  }
  else {
    (this->extension)._M_dataplus._M_p = pcVar2;
    (this->extension).field_2._M_allocated_capacity = paVar10->_M_allocated_capacity;
  }
  (this->extension)._M_string_length = (param_1->extension)._M_string_length;
  (param_1->extension)._M_dataplus._M_p = (pointer)paVar10;
  (param_1->extension)._M_string_length = 0;
  (param_1->extension).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

explicit CopyFunction(const string &name)
	    : Function(name), plan(nullptr), copy_to_select(nullptr), copy_to_bind(nullptr),
	      copy_to_initialize_local(nullptr), copy_to_initialize_global(nullptr),
	      copy_to_get_written_statistics(nullptr), copy_to_sink(nullptr), copy_to_combine(nullptr),
	      copy_to_finalize(nullptr), execution_mode(nullptr), prepare_batch(nullptr), flush_batch(nullptr),
	      desired_batch_size(nullptr), rotate_files(nullptr), rotate_next_file(nullptr), serialize(nullptr),
	      deserialize(nullptr), copy_from_bind(nullptr) {
	}